

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureUnitTests.cpp
# Opt level: O3

Vec4 __thiscall
deqp::gles2::Functional::calculateLodDerivateParts(Functional *this,Mat3 *transformation)

{
  undefined8 uVar1;
  undefined8 uVar2;
  int row;
  long lVar3;
  Vector<float,_3> *pVVar4;
  int col_2;
  Vector<float,_3> *pVVar5;
  int col;
  long lVar6;
  float v;
  float fVar7;
  float v_1;
  float v_2;
  Vec4 VVar8;
  Vector<float,_3> res;
  float local_10 [4];
  
  lVar3 = 0;
  local_10[0] = 0.0;
  local_10[1] = 0.0;
  local_10[2] = 1.0;
  res.m_data[0] = 0.0;
  res.m_data[1] = 0.0;
  pVVar4 = (Vector<float,_3> *)transformation;
  do {
    fVar7 = 0.0;
    lVar6 = 0;
    pVVar5 = pVVar4;
    do {
      fVar7 = fVar7 + ((Vector<tcu::Vector<float,_3>,_3> *)pVVar5->m_data)->m_data[0].m_data[0] *
                      local_10[lVar6];
      lVar6 = lVar6 + 1;
      pVVar5 = pVVar5 + 1;
    } while (lVar6 != 3);
    res.m_data[lVar3] = fVar7;
    uVar1 = res.m_data._0_8_;
    lVar3 = lVar3 + 1;
    pVVar4 = (Vector<float,_3> *)(pVVar4->m_data + 1);
  } while (lVar3 != 3);
  local_10[0] = 0.0;
  local_10[1] = 1.0;
  local_10[2] = 1.0;
  res.m_data[0] = 0.0;
  res.m_data[1] = 0.0;
  lVar3 = 0;
  pVVar4 = (Vector<float,_3> *)transformation;
  do {
    fVar7 = 0.0;
    lVar6 = 0;
    pVVar5 = pVVar4;
    do {
      fVar7 = fVar7 + ((Vector<tcu::Vector<float,_3>,_3> *)pVVar5->m_data)->m_data[0].m_data[0] *
                      local_10[lVar6];
      lVar6 = lVar6 + 1;
      pVVar5 = pVVar5 + 1;
    } while (lVar6 != 3);
    res.m_data[lVar3] = fVar7;
    uVar2 = res.m_data._0_8_;
    lVar3 = lVar3 + 1;
    pVVar4 = (Vector<float,_3> *)(pVVar4->m_data + 1);
  } while (lVar3 != 3);
  local_10[0] = 1.0;
  local_10[1] = 0.0;
  local_10[2] = 1.0;
  res.m_data[0] = 0.0;
  res.m_data[1] = 0.0;
  lVar3 = 0;
  do {
    fVar7 = 0.0;
    lVar6 = 0;
    pVVar4 = (Vector<float,_3> *)transformation;
    do {
      fVar7 = fVar7 + ((Vector<tcu::Vector<float,_3>,_3> *)pVVar4->m_data)->m_data[0].m_data[0] *
                      local_10[lVar6];
      lVar6 = lVar6 + 1;
      pVVar4 = pVVar4 + 1;
    } while (lVar6 != 3);
    res.m_data[lVar3] = fVar7;
    lVar3 = lVar3 + 1;
    transformation = (Mat3 *)(((Vector<float,_3> *)transformation)->m_data + 1);
  } while (lVar3 != 3);
  fVar7 = SUB84(uVar1,4);
  VVar8.m_data[0] = (float)uVar1;
  VVar8.m_data[1] = VVar8.m_data[0];
  *(float *)this = res.m_data[0] - VVar8.m_data[0];
  *(float *)(this + 4) = (float)uVar2 - VVar8.m_data[0];
  *(float *)(this + 8) = res.m_data[1] - fVar7;
  *(float *)(this + 0xc) = SUB84(uVar2,4) - fVar7;
  res.m_data[0] = (float)uVar2;
  res.m_data[1] = SUB84(uVar2,4);
  VVar8.m_data[2] = res.m_data[0];
  VVar8.m_data[3] = res.m_data[1];
  return (Vec4)VVar8.m_data;
}

Assistant:

static Vec4 calculateLodDerivateParts(const Mat3& transformation)
{
	// Calculate transformed coordinates of three corners.
	Vec2 trans00 = (transformation * Vec3(0.0f, 0.0f, 1.0f)).xy();
	Vec2 trans01 = (transformation * Vec3(0.0f, 1.0f, 1.0f)).xy();
	Vec2 trans10 = (transformation * Vec3(1.0f, 0.0f, 1.0f)).xy();

	return Vec4(trans10.x() - trans00.x(),
				trans01.x() - trans00.x(),
				trans10.y() - trans00.y(),
				trans01.y() - trans00.y());
}